

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnlabeledValueArg.h
# Opt level: O0

void __thiscall
TCLAP::
UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::UnlabeledValueArg(UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *this,string *name,string *desc,bool req,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,
                   string *typeDesc,CmdLineInterface *parser,bool ignoreable,Visitor *v)

{
  byte bVar1;
  string *desc_00;
  string *name_00;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator local_61;
  string local_60;
  byte local_39;
  string *psStack_38;
  bool ignoreable_local;
  string *typeDesc_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val_local;
  string *psStack_20;
  bool req_local;
  string *desc_local;
  string *name_local;
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_39 = ignoreable;
  psStack_38 = typeDesc;
  typeDesc_local = val;
  val_local._7_1_ = req;
  psStack_20 = desc;
  desc_local = name;
  name_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"",&local_61);
  name_00 = desc_local;
  desc_00 = psStack_20;
  bVar1 = val_local._7_1_;
  std::__cxx11::string::string((string *)&local_98,(string *)val);
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ValueArg(&this->
            super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ,&local_60,name_00,desc_00,(bool)(bVar1 & 1),&local_98,psStack_38,v);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = val_local._7_1_;
  (this->
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_Arg._vptr_Arg = (_func_int **)&PTR__UnlabeledValueArg_0014e290;
  (this->
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_Arg._ignoreable = (bool)(local_39 & 1);
  (*(this->
    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).super_Arg._vptr_Arg[7])(&local_b8);
  OptionalUnlabeledTracker::check((bool)(bVar1 & 1),&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  (*parser->_vptr_CmdLineInterface[3])(parser,this);
  return;
}

Assistant:

UnlabeledValueArg<T>::UnlabeledValueArg(const std::string& name, 
					                    const std::string& desc, 
										bool req,
					                    T val,
					                    const std::string& typeDesc,
					                    CmdLineInterface& parser,
					                    bool ignoreable,
					                    Visitor* v)
: ValueArg<T>("", name, desc, req, val, typeDesc, v)
{ 
	_ignoreable = ignoreable;
	OptionalUnlabeledTracker::check(req, toString());
	parser.add( this );
}